

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# party.cpp
# Opt level: O0

void __thiscall Party::UpdateHP(Party *this,Character *character)

{
  bool bVar1;
  int iVar2;
  reference ppCVar3;
  Character *member;
  iterator __end1;
  iterator __begin1;
  vector<Character_*,_std::allocator<Character_*>_> *__range1;
  int local_58 [4];
  undefined1 local_48 [8];
  PacketBuilder builder;
  Character *character_local;
  Party *this_local;
  
  builder.add_size = (size_t)character;
  PacketBuilder::PacketBuilder((PacketBuilder *)local_48,PACKET_PARTY,PACKET_AGREE,3);
  iVar2 = Character::PlayerID((Character *)builder.add_size);
  PacketBuilder::AddShort((PacketBuilder *)local_48,(unsigned_short)iVar2);
  local_58[0] = (int)(((double)(int)*(short *)(builder.add_size + 200) /
                      (double)(int)*(short *)(builder.add_size + 0x144)) * 100.0);
  __range1._4_4_ = 0;
  __range1._0_4_ = 100;
  iVar2 = util::clamp<int>(local_58,(int *)((long)&__range1 + 4),(int *)&__range1);
  PacketBuilder::AddChar((PacketBuilder *)local_48,(uchar)iVar2);
  __end1 = std::vector<Character_*,_std::allocator<Character_*>_>::begin(&this->members);
  member = (Character *)std::vector<Character_*,_std::allocator<Character_*>_>::end(&this->members);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                                *)&member);
    if (!bVar1) break;
    ppCVar3 = __gnu_cxx::
              __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
              ::operator*(&__end1);
    Character::Send(*ppCVar3,(PacketBuilder *)local_48);
    __gnu_cxx::
    __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
    operator++(&__end1);
  }
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_48);
  return;
}

Assistant:

void Party::UpdateHP(Character *character)
{
	PacketBuilder builder(PACKET_PARTY, PACKET_AGREE, 3);
	builder.AddShort(character->PlayerID());
	builder.AddChar(util::clamp<int>(double(character->hp) / double(character->maxhp) * 100.0, 0, 100));

	UTIL_FOREACH(this->members, member)
	{
		member->Send(builder);
	}
}